

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-equip-cmp.c
# Opt level: O2

void apply_simple_filter(equippable_filter *f,equippable_summary *s)

{
  wchar_t wVar1;
  equippable_expr *peVar2;
  char cVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  
  s->nfilt = L'\0';
  if (f->simple == EQUIP_EXPR_AND) {
    for (lVar6 = 0; lVar6 < s->nitems; lVar6 = lVar6 + 1) {
      lVar5 = -1;
      lVar4 = 8;
      do {
        lVar5 = lVar5 + 1;
        if (f->nv <= lVar5) {
          wVar1 = s->nfilt;
          if ((s->nitems <= wVar1) || (s->nalloc <= wVar1)) {
            __assert_fail("s->nfilt < s->nitems && s->nfilt < s->nalloc",
                          "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-equip-cmp.c"
                          ,0x6b8,
                          "void apply_simple_filter(const struct equippable_filter *, struct equippable_summary *)"
                         );
          }
          s->sorted_indices[wVar1] = (int)lVar6;
          s->nfilt = s->nfilt + L'\x01';
          break;
        }
        peVar2 = f->v;
        if (*(int *)((long)&(peVar2->s).ex + lVar4) != 0) {
          __assert_fail("f->v[j].c == EQUIP_EXPR_SELECTOR",
                        "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-equip-cmp.c"
                        ,0x6bd,
                        "void apply_simple_filter(const struct equippable_filter *, struct equippable_summary *)"
                       );
        }
        cVar3 = (**(code **)((long)peVar2 + lVar4 + -8))
                          (s->items + lVar6,(long)&(peVar2->s).func + lVar4);
        lVar4 = lVar4 + 0x18;
      } while (cVar3 != '\0');
    }
  }
  else {
    if (f->simple != EQUIP_EXPR_OR) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-equip-cmp.c"
                    ,0x6de,
                    "void apply_simple_filter(const struct equippable_filter *, struct equippable_summary *)"
                   );
    }
    for (lVar6 = 0; lVar6 < s->nitems; lVar6 = lVar6 + 1) {
      lVar5 = -1;
      lVar4 = 8;
      do {
        lVar5 = lVar5 + 1;
        if (f->nv <= lVar5) goto LAB_001d8190;
        peVar2 = f->v;
        if (*(int *)((long)&(peVar2->s).ex + lVar4) != 0) {
          __assert_fail("f->v[j].c == EQUIP_EXPR_SELECTOR",
                        "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-equip-cmp.c"
                        ,0x6cf,
                        "void apply_simple_filter(const struct equippable_filter *, struct equippable_summary *)"
                       );
        }
        cVar3 = (**(code **)((long)peVar2 + lVar4 + -8))
                          (s->items + lVar6,(long)&(peVar2->s).func + lVar4);
        lVar4 = lVar4 + 0x18;
      } while (cVar3 == '\0');
      wVar1 = s->nfilt;
      if ((s->nitems <= wVar1) || (s->nalloc <= wVar1)) {
        __assert_fail("s->nfilt < s->nitems && s->nfilt < s->nalloc",
                      "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-equip-cmp.c"
                      ,0x6d3,
                      "void apply_simple_filter(const struct equippable_filter *, struct equippable_summary *)"
                     );
      }
      s->sorted_indices[wVar1] = (int)lVar6;
      s->nfilt = s->nfilt + L'\x01';
LAB_001d8190:
    }
  }
  s->sorted_indices[s->nfilt] = -1;
  return;
}

Assistant:

static void apply_simple_filter(const struct equippable_filter *f,
	struct equippable_summary *s)
{
	int i;

	s->nfilt = 0;
	switch (f->simple) {
	case EQUIP_EXPR_AND:
		for (i = 0; i < s->nitems; ++i) {
			int j = 0;

			while (1) {
				if (j >= f->nv) {
					assert(s->nfilt < s->nitems &&
						s->nfilt < s->nalloc);
					s->sorted_indices[s->nfilt] = i;
					++s->nfilt;
					break;
				}
				assert(f->v[j].c == EQUIP_EXPR_SELECTOR);
				if (! (*f->v[j].s.func)(s->items + i,
					&f->v[j].s.ex)) {
					break;
				}
				++j;
			}
		}
		break;

	case EQUIP_EXPR_OR:
		for (i = 0; i < s->nitems; ++i) {
			int j = 0;

			while (1) {
				if (j >= f->nv) {
					break;
				}
				assert(f->v[j].c == EQUIP_EXPR_SELECTOR);
				if ((*f->v[j].s.func)(s->items + i, 
					&f->v[j].s.ex)) {
					assert(s->nfilt < s->nitems &&
						s->nfilt < s->nalloc);
					s->sorted_indices[s->nfilt] = i;
					++s->nfilt;
					break;
				}
				++j;
			}
		}
		break;

	default:
		assert(0);
	}

	s->sorted_indices[s->nfilt] = -1;
}